

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# location_fwd.hpp
# Opt level: O2

void __thiscall toml::detail::location::location(location *this,location *param_1)

{
  size_t sVar1;
  
  std::
  __shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)this,(__shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          *)param_1);
  std::__cxx11::string::string((string *)&this->source_name_,&param_1->source_name_);
  this->column_number_ = param_1->column_number_;
  sVar1 = param_1->line_number_;
  this->location_ = param_1->location_;
  this->line_number_ = sVar1;
  return;
}

Assistant:

location(const location&) = default;